

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclientconnector.hpp
# Opt level: O0

void __thiscall
TestClientConnector::VerifyNotificationRequest
          (TestClientConnector *this,version version,string *name)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  bool bVar2;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  byte extraout_AL_04;
  reference pvVar3;
  double __x;
  double __x_00;
  double dVar4;
  double __x_01;
  Expression_lhs<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
  EVar5;
  allocator<char> local_5e1;
  string local_5e0;
  bool local_5bd;
  ExpressionDecomposer local_5bc;
  Expression_lhs<bool> local_5b8;
  Result local_5b0;
  String local_590;
  undefined1 local_578 [8];
  ResultBuilder DOCTEST_RB_5;
  Expression_lhs<bool> local_4e0;
  Result local_4d8;
  String local_4b8;
  undefined1 local_4a0 [8];
  ResultBuilder DOCTEST_RB_4;
  string local_408;
  bool local_3e5;
  ExpressionDecomposer local_3e4;
  Expression_lhs<bool> local_3e0;
  Result local_3d8;
  String local_3b8;
  undefined1 local_3a0 [8];
  ResultBuilder DOCTEST_RB_3;
  string local_308;
  bool local_2e5;
  ExpressionDecomposer local_2e4;
  Expression_lhs<bool> local_2e0;
  Result local_2d8;
  String local_2b8;
  undefined1 local_2a0 [8];
  ResultBuilder DOCTEST_RB_2;
  ExpressionDecomposer local_1fc;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_1f8;
  Enum local_1f0;
  Result local_1e8;
  String local_1c8;
  undefined1 local_1b0 [8];
  ResultBuilder DOCTEST_RB_1;
  ExpressionDecomposer local_10c;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_108;
  Enum local_100;
  Result local_f8;
  String local_c8;
  undefined1 local_b0 [8];
  ResultBuilder DOCTEST_RB;
  string *name_local;
  version version_local;
  TestClientConnector *this_local;
  
  DOCTEST_RB.super_AssertData.m_exception_string._24_8_ = name;
  doctest::String::String(&local_c8,"");
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)local_b0,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
             ,0x3b,"request[\"method\"] == name","",&local_c8);
  doctest::String::~String(&local_c8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_10c,DT_CHECK);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&this->request,"method");
  EVar5 = doctest::detail::ExpressionDecomposer::operator<<(&local_10c,pvVar3);
  DOCTEST_RB_1.super_AssertData.m_exception_string._24_8_ = EVar5.lhs;
  local_100 = EVar5.m_at;
  local_108 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)DOCTEST_RB_1.super_AssertData.m_exception_string._24_8_;
  doctest::detail::
  Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
  ::operator==(&local_f8,
               (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                *)&local_108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               DOCTEST_RB.super_AssertData.m_exception_string._24_8_);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_b0,&local_f8);
  doctest::detail::Result::~Result(&local_f8);
  doctest::detail::ResultBuilder::log((ResultBuilder *)local_b0,__x);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)local_b0);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_b0);
  if (version == v2) {
    doctest::String::String(&local_1c8,"");
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_1b0,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x3d,"request[\"jsonrpc\"] == \"2.0\"","",&local_1c8);
    doctest::String::~String(&local_1c8);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1fc,DT_CHECK);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&this->request,"jsonrpc");
    EVar5 = doctest::detail::ExpressionDecomposer::operator<<(&local_1fc,pvVar3);
    DOCTEST_RB_2.super_AssertData.m_exception_string._24_8_ = EVar5.lhs;
    local_1f0 = EVar5.m_at;
    local_1f8 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)DOCTEST_RB_2.super_AssertData.m_exception_string._24_8_;
    doctest::detail::
    Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
    ::operator==(&local_1e8,
                 (Expression_lhs<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>&>
                  *)&local_1f8,(char (*) [4])"2.0");
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_1b0,&local_1e8);
    doctest::detail::Result::~Result(&local_1e8);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_1b0,__x_00);
    if ((extraout_AL_00 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_1b0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_1b0);
    doctest::String::String(&local_2b8,"");
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2a0,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x3e,"!has_key(request, \"id\")","",&local_2b8);
    doctest::String::~String(&local_2b8);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_2e4,DT_CHECK);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"id",
               (allocator<char> *)&DOCTEST_RB_3.super_AssertData.m_exception_string.field_0x1f);
    bVar2 = jsonrpccxx::has_key(&this->request,&local_308);
    local_2e5 = (bool)(~bVar2 & 1);
    local_2e0 = doctest::detail::ExpressionDecomposer::operator<<(&local_2e4,&local_2e5);
    doctest::detail::Expression_lhs::operator_cast_to_Result
              (&local_2d8,(Expression_lhs *)&local_2e0);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_2a0,&local_2d8);
    doctest::detail::Result::~Result(&local_2d8);
    std::__cxx11::string::~string((string *)&local_308);
    dVar4 = (double)std::allocator<char>::~allocator
                              ((allocator<char> *)
                               &DOCTEST_RB_3.super_AssertData.m_exception_string.field_0x1f);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_2a0,dVar4);
    if ((extraout_AL_01 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_2a0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2a0);
  }
  else {
    doctest::String::String(&local_3b8,"");
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_3a0,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x40,"!has_key(request, \"jsonrpc\")","",&local_3b8);
    doctest::String::~String(&local_3b8);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3e4,DT_CHECK);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"jsonrpc",
               (allocator<char> *)&DOCTEST_RB_4.super_AssertData.m_exception_string.field_0x1f);
    bVar2 = jsonrpccxx::has_key(&this->request,&local_408);
    local_3e5 = (bool)(~bVar2 & 1);
    local_3e0 = doctest::detail::ExpressionDecomposer::operator<<(&local_3e4,&local_3e5);
    doctest::detail::Expression_lhs::operator_cast_to_Result
              (&local_3d8,(Expression_lhs *)&local_3e0);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_3a0,&local_3d8);
    doctest::detail::Result::~Result(&local_3d8);
    std::__cxx11::string::~string((string *)&local_408);
    dVar4 = (double)std::allocator<char>::~allocator
                              ((allocator<char> *)
                               &DOCTEST_RB_4.super_AssertData.m_exception_string.field_0x1f);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_3a0,dVar4);
    if ((extraout_AL_02 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_3a0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_3a0);
    doctest::String::String(&local_4b8,"");
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_4a0,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x41,"request[\"id\"].is_null()","",&local_4b8);
    doctest::String::~String(&local_4b8);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer
              ((ExpressionDecomposer *)&DOCTEST_RB_5.super_AssertData.m_exception_string.field_0x1c,
               DT_CHECK);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&this->request,"id");
    DOCTEST_RB_5.super_AssertData.m_exception_string._27_1_ =
         nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::is_null(pvVar3);
    local_4e0 = doctest::detail::ExpressionDecomposer::operator<<
                          ((ExpressionDecomposer *)
                           &DOCTEST_RB_5.super_AssertData.m_exception_string.field_0x1c,
                           (bool *)&DOCTEST_RB_5.super_AssertData.m_exception_string.field_0x1b);
    doctest::detail::Expression_lhs::operator_cast_to_Result
              (&local_4d8,(Expression_lhs *)&local_4e0);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_4a0,&local_4d8);
    doctest::detail::Result::~Result(&local_4d8);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_4a0,__x_01);
    if ((extraout_AL_03 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_4a0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_4a0);
    doctest::String::String(&local_590,"");
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_578,DT_CHECK,
               "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testclientconnector.hpp"
               ,0x42,"has_key(request, \"params\")","",&local_590);
    doctest::String::~String(&local_590);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_5bc,DT_CHECK);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e0,"params",&local_5e1);
    local_5bd = jsonrpccxx::has_key(&this->request,&local_5e0);
    local_5b8 = doctest::detail::ExpressionDecomposer::operator<<(&local_5bc,&local_5bd);
    doctest::detail::Expression_lhs::operator_cast_to_Result
              (&local_5b0,(Expression_lhs *)&local_5b8);
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)local_578,&local_5b0);
    doctest::detail::Result::~Result(&local_5b0);
    std::__cxx11::string::~string((string *)&local_5e0);
    dVar4 = (double)std::allocator<char>::~allocator(&local_5e1);
    doctest::detail::ResultBuilder::log((ResultBuilder *)local_578,dVar4);
    if ((extraout_AL_04 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)local_578);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)local_578);
  }
  return;
}

Assistant:

void VerifyNotificationRequest(version version, const string &name) {
    CHECK(request["method"] == name);
    if (version == version::v2) {
      CHECK(request["jsonrpc"] == "2.0");
      CHECK(!has_key(request, "id"));
    } else {
      CHECK(!has_key(request, "jsonrpc"));
      CHECK(request["id"].is_null());
      CHECK(has_key(request, "params"));
    }
  }